

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O1

int32_t upb_Message_GetInt32(upb_Message *msg,upb_MiniTableField *f,int32_t default_val)

{
  byte bVar1;
  byte bVar2;
  undefined8 in_RAX;
  ulong uVar3;
  ulong uVar4;
  upb_MessageValue uVar5;
  
  bVar1 = f->descriptortype_dont_copy_me__upb_internal_use_only;
  uVar3 = (ulong)bVar1;
  bVar2 = f->mode_dont_copy_me__upb_internal_use_only;
  if ((bVar2 & 0x10) == 0) {
    uVar4 = uVar3 - 1;
  }
  else {
    uVar4 = 0xd;
    if (uVar3 != 5) {
      if (bVar1 != 0xc) goto LAB_0017e0b0;
      uVar4 = 8;
    }
  }
  if ((0x14010UL >> (uVar4 & 0x3f) & 1) == 0) {
    if ((bVar2 & 0x10) == 0) {
      if (bVar1 != 0xe) {
LAB_0017e091:
        __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Int32 || upb_MiniTableField_CType(f) == kUpb_CType_Enum"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,399,
                      "int32_t upb_Message_GetInt32(const struct upb_Message *, const upb_MiniTableField *, int32_t)"
                     );
      }
    }
    else if (uVar3 != 5) {
      if (bVar1 != 0xc) {
LAB_0017e0b0:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                      ,0x7b,
                      "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
      }
      goto LAB_0017e091;
    }
  }
  uVar5._8_8_ = CONCAT71((int7)((ulong)in_RAX >> 8),bVar2) & 0xffffff03;
  if ((char)uVar5._8_8_ != '\x02') {
    __assert_fail("upb_MiniTableField_IsScalar(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,400,
                  "int32_t upb_Message_GetInt32(const struct upb_Message *, const upb_MiniTableField *, int32_t)"
                 );
  }
  if ((bVar2 & 0xc0) != 0x40) {
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_4Byte"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x191,
                  "int32_t upb_Message_GetInt32(const struct upb_Message *, const upb_MiniTableField *, int32_t)"
                 );
  }
  uVar5.int64_val._4_4_ = 0;
  uVar5.int32_val = default_val;
  uVar5 = upb_Message_GetField(msg,f,uVar5);
  return uVar5._0_4_;
}

Assistant:

UPB_API_INLINE int32_t upb_Message_GetInt32(const struct upb_Message* msg,
                                            const upb_MiniTableField* f,
                                            int32_t default_val) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Int32 ||
             upb_MiniTableField_CType(f) == kUpb_CType_Enum);
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) == kUpb_FieldRep_4Byte);

  upb_MessageValue def;
  def.int32_val = default_val;
  return upb_Message_GetField(msg, f, def).int32_val;
}